

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

int Int_ManGlobalVars(Int_Man_t *p)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int local_2c;
  int local_28;
  int v;
  int nVarsAB;
  int Var;
  Sto_Cls_t *pClause;
  Int_Man_t *p_local;
  
  _nVarsAB = p->pCnf->pHead;
  while( true ) {
    bVar3 = false;
    if (_nVarsAB != (Sto_Cls_t *)0x0) {
      bVar3 = (*(uint *)&_nVarsAB->field_0x1c >> 1 & 1) != 0;
    }
    if ((!bVar3) || ((*(uint *)&_nVarsAB->field_0x1c & 1) == 0)) break;
    for (local_2c = 0; local_2c < (int)(*(uint *)&_nVarsAB->field_0x1c >> 3 & 0xffffff);
        local_2c = local_2c + 1) {
      piVar1 = p->pVarTypes;
      iVar2 = lit_var(*(lit *)((long)&_nVarsAB[1].pNext + (long)local_2c * 4));
      piVar1[iVar2] = 1;
    }
    _nVarsAB = _nVarsAB->pNext;
  }
  if (p->nGloVars == 0) {
    _nVarsAB = p->pCnf->pHead;
    while( true ) {
      bVar3 = false;
      if (_nVarsAB != (Sto_Cls_t *)0x0) {
        bVar3 = (*(uint *)&_nVarsAB->field_0x1c >> 1 & 1) != 0;
      }
      if (!bVar3) break;
      if ((*(uint *)&_nVarsAB->field_0x1c & 1) == 0) {
        for (local_2c = 0; local_2c < (int)(*(uint *)&_nVarsAB->field_0x1c >> 3 & 0xffffff);
            local_2c = local_2c + 1) {
          iVar2 = lit_var(*(lit *)((long)&_nVarsAB[1].pNext + (long)local_2c * 4));
          if (p->pVarTypes[iVar2] == 1) {
            p->pVarTypes[iVar2] = -1;
          }
        }
      }
      _nVarsAB = _nVarsAB->pNext;
    }
    local_28 = 0;
    for (local_2c = 0; local_2c < p->pCnf->nVars; local_2c = local_2c + 1) {
      if (p->pVarTypes[local_2c] == -1) {
        p->pVarTypes[local_2c] = p->pVarTypes[local_2c] - local_28;
        local_28 = local_28 + 1;
      }
    }
    p_local._4_4_ = local_28;
  }
  else {
    for (local_2c = 0; local_2c < p->nGloVars; local_2c = local_2c + 1) {
      p->pVarTypes[p->pGloVars[local_2c]] = -1 - local_2c;
    }
    p_local._4_4_ = p->nGloVars;
  }
  return p_local._4_4_;
}

Assistant:

int Int_ManGlobalVars( Int_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, nVarsAB, v;

    // mark the variable encountered in the clauses of A
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA )
            break;
        for ( v = 0; v < (int)pClause->nLits; v++ )
            p->pVarTypes[lit_var(pClause->pLits[v])] = 1;
    }

    if ( p->nGloVars )
    {
        for ( v = 0; v < p->nGloVars; v++ )
            p->pVarTypes[ p->pGloVars[v] ] = - v - 1;
        return p->nGloVars;
    }

    // check variables that appear in clauses of B
    nVarsAB = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( pClause->fA )
            continue;
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] == 1 ) // var of A
            {
                // change it into a global variable
                nVarsAB++;
                p->pVarTypes[Var] = -1;
            }
        }
    }

    // order global variables
    nVarsAB = 0;
    for ( v = 0; v < p->pCnf->nVars; v++ )
        if ( p->pVarTypes[v] == -1 )
            p->pVarTypes[v] -= nVarsAB++;
//printf( "There are %d global variables.\n", nVarsAB );
    return nVarsAB;
}